

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argparse.hpp
# Opt level: O0

void __thiscall
argparse::ArgumentParser::parse_args_internal
          (ArgumentParser *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *aArguments)

{
  string_view aName;
  string_view usedName;
  string_view usedName_00;
  string_view usedName_01;
  bool bVar1;
  ulong uVar2;
  const_reference pvVar3;
  pointer ppVar4;
  ostream *poVar5;
  char *pcVar6;
  ulong uVar7;
  undefined1 *puVar8;
  runtime_error *prVar9;
  string *in_RDI;
  undefined1 auVar10 [16];
  _List_iterator<argparse::Argument> tArgument_2;
  iterator tIterator2;
  string tHypotheticalArgument;
  size_t j;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *tCompoundArgument;
  _List_iterator<argparse::Argument> tArgument_1;
  iterator tIterator;
  _Self tArgument;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *tCurrentArgument;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  it;
  iterator positionalArgumentIt;
  const_iterator end;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  in_stack_fffffffffffffe28;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffe30;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffe40;
  iterator in_stack_fffffffffffffe50;
  char *in_stack_fffffffffffffe58;
  iterator in_stack_fffffffffffffeb8;
  iterator in_stack_fffffffffffffec0;
  undefined6 in_stack_fffffffffffffec8;
  _Alloc_hider in_stack_fffffffffffffece;
  undefined1 in_stack_fffffffffffffecf;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  in_stack_fffffffffffffed0;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  in_stack_fffffffffffffed8;
  string local_120 [32];
  ulong local_100;
  ArgumentParser *in_stack_ffffffffffffff08;
  ostream *in_stack_ffffffffffffff10;
  _Self local_b8;
  _Self local_b0;
  _Self local_a8;
  _Self local_a0;
  _Self local_98;
  basic_string_view<char,_std::char_traits<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_70;
  _List_node_base *local_68;
  _Self local_50;
  undefined1 local_48 [16];
  ArgumentParser *local_38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_30;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_28;
  _Self local_20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_18;
  
  uVar2 = std::__cxx11::string::empty();
  if (((uVar2 & 1) != 0) &&
     (bVar1 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::empty(in_stack_fffffffffffffe40), !bVar1)) {
    pvVar3 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::front(in_stack_fffffffffffffe30);
    std::__cxx11::string::operator=(in_RDI,(string *)pvVar3);
  }
  local_18 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::end<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                       (in_stack_fffffffffffffe28._M_current);
  local_20._M_node =
       (_List_node_base *)
       std::begin<std::__cxx11::list<argparse::Argument,std::allocator<argparse::Argument>>>
                 ((list<argparse::Argument,_std::allocator<argparse::Argument>_> *)
                  in_stack_fffffffffffffe28._M_current);
  local_30 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::begin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                       (in_stack_fffffffffffffe28._M_current);
  local_28 = std::
             next<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                       (in_stack_fffffffffffffe28,0x12bcff);
  while( true ) {
    while( true ) {
      while( true ) {
        bVar1 = __gnu_cxx::operator!=
                          ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)in_stack_fffffffffffffe30,
                           (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)in_stack_fffffffffffffe28._M_current);
        if (!bVar1) {
          return;
        }
        local_38 = (ArgumentParser *)
                   __gnu_cxx::
                   __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator*(&local_28);
        auVar10 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_38);
        aName._M_str = in_stack_fffffffffffffe58;
        aName._M_len = (size_t)in_stack_fffffffffffffe50._M_node;
        local_48 = auVar10;
        bVar1 = Argument::is_positional(aName);
        if (!bVar1) break;
        local_50._M_node =
             (_List_node_base *)
             std::end<std::__cxx11::list<argparse::Argument,std::allocator<argparse::Argument>>>
                       ((list<argparse::Argument,_std::allocator<argparse::Argument>_> *)
                        in_stack_fffffffffffffe28._M_current);
        bVar1 = std::operator==(&local_20,&local_50);
        if (bVar1) {
          prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error
                    (prVar9,"Maximum number of positional arguments exceeded");
          __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        local_68 = (_List_node_base *)
                   std::_List_iterator<argparse::Argument>::operator++(&local_20,0);
        std::_List_iterator<argparse::Argument>::operator->
                  ((_List_iterator<argparse::Argument> *)0x12be2b);
        local_78 = local_28._M_current;
        local_80 = local_18;
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_90);
        usedName._M_str._0_6_ = in_stack_fffffffffffffec8;
        usedName._M_len = (size_t)in_stack_fffffffffffffec0._M_node;
        usedName._M_str._6_1_ = in_stack_fffffffffffffece;
        usedName._M_str._7_1_ = in_stack_fffffffffffffecf;
        local_70 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   Argument::
                   consume<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                             ((Argument *)in_stack_fffffffffffffeb8._M_node,
                              in_stack_fffffffffffffed8,in_stack_fffffffffffffed0,usedName);
        local_28 = (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    )local_70;
      }
      local_98._M_node =
           (_Base_ptr)
           std::
           map<std::basic_string_view<char,std::char_traits<char>>,std::_List_iterator<argparse::Argument>,std::less<void>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::_List_iterator<argparse::Argument>>>>
           ::find<std::__cxx11::string>
                     ((map<std::basic_string_view<char,_std::char_traits<char>_>,_std::_List_iterator<argparse::Argument>,_std::less<void>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::_List_iterator<argparse::Argument>_>_>_>
                       *)in_stack_fffffffffffffe28._M_current,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x12bebd)
      ;
      local_a0._M_node =
           (_Base_ptr)
           std::
           map<std::basic_string_view<char,_std::char_traits<char>_>,_std::_List_iterator<argparse::Argument>,_std::less<void>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::_List_iterator<argparse::Argument>_>_>_>
           ::end((map<std::basic_string_view<char,_std::char_traits<char>_>,_std::_List_iterator<argparse::Argument>,_std::less<void>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::_List_iterator<argparse::Argument>_>_>_>
                  *)in_stack_fffffffffffffe28._M_current);
      bVar1 = std::operator!=(&local_98,&local_a0);
      if (!bVar1) break;
      ppVar4 = std::
               _Rb_tree_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::_List_iterator<argparse::Argument>_>_>
               ::operator->((_Rb_tree_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::_List_iterator<argparse::Argument>_>_>
                             *)0x12bf09);
      local_a8._M_node = (ppVar4->second)._M_node;
      local_b0._M_node =
           (_List_node_base *)
           std::__cxx11::list<argparse::Argument,_std::allocator<argparse::Argument>_>::begin
                     ((list<argparse::Argument,_std::allocator<argparse::Argument>_> *)
                      in_stack_fffffffffffffe28._M_current);
      bVar1 = std::operator==(&local_a8,&local_b0);
      if (bVar1) {
        argparse::operator<<(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
        exit(0);
      }
      std::__cxx11::list<argparse::Argument,_std::allocator<argparse::Argument>_>::begin
                ((list<argparse::Argument,_std::allocator<argparse::Argument>_> *)
                 in_stack_fffffffffffffe28._M_current);
      local_b8._M_node =
           (_List_node_base *)
           std::next<std::_List_iterator<argparse::Argument>>
                     ((_List_iterator<argparse::Argument>)in_stack_fffffffffffffe28._M_current,
                      0x12bf8c);
      bVar1 = std::operator==(&local_a8,&local_b8);
      if (bVar1) {
        poVar5 = std::operator<<((ostream *)&std::cout,in_RDI + 0x20);
        std::operator<<(poVar5,"\n");
        exit(0);
      }
      std::_List_iterator<argparse::Argument>::operator->
                ((_List_iterator<argparse::Argument> *)0x12bfe9);
      std::
      next<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                (in_stack_fffffffffffffe28,0x12c010);
      ppVar4 = std::
               _Rb_tree_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::_List_iterator<argparse::Argument>_>_>
               ::operator->((_Rb_tree_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::_List_iterator<argparse::Argument>_>_>
                             *)0x12c035);
      in_stack_ffffffffffffff10 = (ostream *)(ppVar4->first)._M_len;
      usedName_00._M_str._0_6_ = in_stack_fffffffffffffec8;
      usedName_00._M_len = (size_t)in_stack_fffffffffffffec0._M_node;
      usedName_00._M_str._6_1_ = in_stack_fffffffffffffece;
      usedName_00._M_str._7_1_ = in_stack_fffffffffffffecf;
      local_28 = Argument::
                 consume<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                           ((Argument *)in_stack_fffffffffffffeb8._M_node,in_stack_fffffffffffffed8,
                            in_stack_fffffffffffffed0,usedName_00);
    }
    in_stack_ffffffffffffff08 = local_38;
    uVar2 = std::__cxx11::string::size();
    if (uVar2 < 2) break;
    pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)in_stack_ffffffffffffff08);
    if (*pcVar6 != '-') break;
    pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)in_stack_ffffffffffffff08);
    if (*pcVar6 == '-') break;
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&local_28);
    local_100 = 1;
    while( true ) {
      uVar2 = local_100;
      uVar7 = std::__cxx11::string::size();
      if (uVar7 <= uVar2) break;
      in_stack_fffffffffffffece = (_Alloc_hider)0x2d;
      puVar8 = (undefined1 *)std::__cxx11::string::operator[]((ulong)in_stack_ffffffffffffff08);
      in_stack_fffffffffffffecf = *puVar8;
      in_stack_fffffffffffffed0._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &stack0xfffffffffffffece;
      in_stack_fffffffffffffed8._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2;
      in_stack_fffffffffffffe58 = &stack0xfffffffffffffecd;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_120,in_stack_fffffffffffffed0._M_current,in_stack_fffffffffffffed8._M_current
                 ,in_stack_fffffffffffffe58);
      std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffecd);
      in_stack_fffffffffffffe50 =
           std::
           map<std::basic_string_view<char,std::char_traits<char>>,std::_List_iterator<argparse::Argument>,std::less<void>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::_List_iterator<argparse::Argument>>>>
           ::find<std::__cxx11::string>
                     ((map<std::basic_string_view<char,_std::char_traits<char>_>,_std::_List_iterator<argparse::Argument>,_std::less<void>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::_List_iterator<argparse::Argument>_>_>_>
                       *)in_stack_fffffffffffffe28._M_current,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x12c1d7)
      ;
      in_stack_fffffffffffffec0 = in_stack_fffffffffffffe50;
      in_stack_fffffffffffffeb8 =
           std::
           map<std::basic_string_view<char,_std::char_traits<char>_>,_std::_List_iterator<argparse::Argument>,_std::less<void>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::_List_iterator<argparse::Argument>_>_>_>
           ::end((map<std::basic_string_view<char,_std::char_traits<char>_>,_std::_List_iterator<argparse::Argument>,_std::less<void>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::_List_iterator<argparse::Argument>_>_>_>
                  *)in_stack_fffffffffffffe28._M_current);
      bVar1 = std::operator!=((_Self *)&stack0xfffffffffffffec0,(_Self *)&stack0xfffffffffffffeb8);
      if (!bVar1) {
        prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar9,"Unknown argument");
        __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      std::
      _Rb_tree_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::_List_iterator<argparse::Argument>_>_>
      ::operator->((_Rb_tree_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::_List_iterator<argparse::Argument>_>_>
                    *)0x12c234);
      std::_List_iterator<argparse::Argument>::operator->
                ((_List_iterator<argparse::Argument> *)0x12c24d);
      std::
      _Rb_tree_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::_List_iterator<argparse::Argument>_>_>
      ::operator->((_Rb_tree_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::_List_iterator<argparse::Argument>_>_>
                    *)0x12c276);
      usedName_01._M_str._0_6_ = in_stack_fffffffffffffec8;
      usedName_01._M_len = (size_t)in_stack_fffffffffffffec0._M_node;
      usedName_01._M_str._6_1_ = in_stack_fffffffffffffece;
      usedName_01._M_str._7_1_ = in_stack_fffffffffffffecf;
      local_28 = Argument::
                 consume<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                           ((Argument *)in_stack_fffffffffffffeb8._M_node,in_stack_fffffffffffffed8,
                            in_stack_fffffffffffffed0,usedName_01);
      std::__cxx11::string::~string(local_120);
      local_100 = local_100 + 1;
    }
  }
  prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(prVar9,"Unknown argument");
  __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void parse_args_internal(const std::vector<std::string> &aArguments) {
    if (mProgramName.empty() && !aArguments.empty()) {
      mProgramName = aArguments.front();
    }
    auto end = std::end(aArguments);
    auto positionalArgumentIt = std::begin(mPositionalArguments);
    for (auto it = std::next(std::begin(aArguments)); it != end;) {
      const auto &tCurrentArgument = *it;
      if (Argument::is_positional(tCurrentArgument)) {
        if (positionalArgumentIt == std::end(mPositionalArguments)) {
          throw std::runtime_error(
              "Maximum number of positional arguments exceeded");
        }
        auto tArgument = positionalArgumentIt++;
        it = tArgument->consume(it, end);
        continue;
      }

      auto tIterator = mArgumentMap.find(tCurrentArgument);
      if (tIterator != mArgumentMap.end()) {
        auto tArgument = tIterator->second;

        // the first optional argument is --help
        if (tArgument == mOptionalArguments.begin()) {
          std::cout << *this;
          std::exit(0);
        }
        // the second optional argument is --version 
        else if (tArgument == std::next(mOptionalArguments.begin(), 1)) {
          std::cout << mVersion << "\n";
          std::exit(0);
        }

        it = tArgument->consume(std::next(it), end, tIterator->first);
      } else if (const auto &tCompoundArgument = tCurrentArgument;
                 tCompoundArgument.size() > 1 && tCompoundArgument[0] == '-' &&
                 tCompoundArgument[1] != '-') {
        ++it;
        for (size_t j = 1; j < tCompoundArgument.size(); j++) {
          auto tHypotheticalArgument = std::string{'-', tCompoundArgument[j]};
          auto tIterator2 = mArgumentMap.find(tHypotheticalArgument);
          if (tIterator2 != mArgumentMap.end()) {
            auto tArgument = tIterator2->second;
            it = tArgument->consume(it, end, tIterator2->first);
          } else {
            throw std::runtime_error("Unknown argument");
          }
        }
      } else {
        throw std::runtime_error("Unknown argument");
      }
    }
  }